

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

bool upb_test_MapTest_map_string_double_set
               (upb_test_MapTest *msg,upb_StringView key,double val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map;
  double val_local;
  upb_MiniTableField field;
  upb_StringView key_local;
  
  key_local.size = key.size;
  key_local.data = key.data;
  field.number_dont_copy_me__upb_internal_use_only = 1;
  field.offset_dont_copy_me__upb_internal_use_only = 8;
  field.presence = 0;
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  val_local = val;
  map = _upb_Message_GetOrCreateMutableMap
                  (&msg->base_dont_copy_me__upb_internal_use_only,&field,0,8,a);
  uVar1 = _upb_Map_Insert(map,&key_local,0,&val_local,8,a);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool upb_test_MapTest_map_string_double_set(upb_test_MapTest* msg, upb_StringView key, double val, upb_Arena* a) {
  const upb_MiniTableField field = {1, 8, 0, 0, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__MapTest__MapStringDoubleEntry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, 0, sizeof(val), a);
  return _upb_Map_Insert(map, &key, 0, &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}